

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadCodeElimination.cpp
# Opt level: O1

void __thiscall
wasm::DeadCodeElimination::visitExpression(DeadCodeElimination *this,Expression *curr)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Id IVar1;
  uintptr_t uVar2;
  byte bVar3;
  Builder BVar4;
  Index IVar5;
  Index IVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  Drop *this_01;
  Block *expression;
  Expression ***pppEVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  Expression *pEVar14;
  ulong uVar15;
  int iVar16;
  TypeUpdater *this_02;
  Index IVar17;
  bool bVar18;
  Expression *local_c0;
  Expression *child;
  TypeUpdater *local_b0;
  AbstractChildIterator<wasm::ChildIterator> local_a8;
  Builder local_68;
  Builder builder;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> remainingChildren;
  
  IVar1 = curr->_id;
  if ((int)IVar1 < 3) {
    if (IVar1 == BlockId) {
      this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(curr + 2);
      uVar15 = curr[2].type.id;
      if (uVar15 != 0) {
        uVar7 = 0;
        uVar12 = 1;
        do {
          uVar11 = (uint)uVar12;
          if ((this_00->data[uVar7]->type).id == 1) goto LAB_006d19fa;
          bVar10 = uVar12 < uVar15;
          uVar7 = uVar12;
          uVar12 = (ulong)(uVar11 + 1);
        } while (bVar10);
      }
      uVar11 = 0;
LAB_006d19fa:
      if (uVar11 != 0) {
        uVar15 = (ulong)uVar11;
        if (uVar15 < curr[2].type.id) {
          uVar7 = uVar15;
          do {
            uVar11 = uVar11 + 1;
            TypeUpdater::noteRecursiveRemoval
                      (&this->typeUpdater,*(Expression **)(*(long *)(curr + 2) + uVar7 * 8));
            uVar7 = (ulong)uVar11;
          } while (uVar7 < curr[2].type.id);
        }
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize(this_00,uVar15)
        ;
        if ((curr[2].type.id == 1) && (pEVar14 = *this_00->data, pEVar14->_id == UnreachableId))
        goto LAB_006d1abd;
      }
      if ((curr->type).id < 2) {
        return;
      }
      uVar2 = curr[2].type.id;
      if (uVar2 == 0) {
        __assert_fail("usedElements > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xd0,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      if ((this_00->data[uVar2 - 1]->type).id != 1) {
        return;
      }
      if ((curr[1].type.id != 0) &&
         (pmVar8 = std::
                   map<wasm::Name,_wasm::TypeUpdater::BlockInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>_>
                   ::operator[](&(this->typeUpdater).blockInfos,(key_type *)(curr + 1)),
         0 < pmVar8->numBreaks)) {
        return;
      }
      if ((curr->type).id == 1) {
        return;
      }
LAB_006d1b2d:
      (curr->type).id = 1;
      TypeUpdater::propagateTypesUp(&this->typeUpdater,curr);
      return;
    }
    if (IVar1 != IfId) {
LAB_006d1933:
      if ((curr->type).id == 1) {
        builder.wasm = (Module *)this;
        AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_a8,curr);
        iVar16 = (int)((ulong)((long)local_a8.children.flexible.
                                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_a8.children.flexible.
                                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                 (int)local_a8.children.usedFixed;
        if (iVar16 == 0) {
          bVar10 = false;
        }
        else {
          IVar17 = 0;
          do {
            IVar5 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_a8,IVar17);
            pppEVar9 = local_a8.children.flexible.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data._M_start + ((ulong)IVar5 - 4);
            if (IVar5 < 4) {
              pppEVar9 = local_a8.children.fixed._M_elems + IVar5;
            }
            bVar10 = false;
            if (((**pppEVar9)->type).id == 1) {
              bVar10 = true;
              break;
            }
            bVar18 = iVar16 - 1U != IVar17;
            IVar17 = IVar17 + 1;
          } while (bVar18);
        }
        BVar4.wasm = builder.wasm;
        if (local_a8.children.flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_a8.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar10) {
          local_68.wasm =
               (Module *)
               ((BVar4.wasm)->debugInfoFileNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          auStack_58 = (undefined1  [8])0x0;
          remainingChildren.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          remainingChildren.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_a8,curr);
          IVar17 = (int)((ulong)((long)local_a8.children.flexible.
                                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_a8.children.flexible.
                                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                   (int)local_a8.children.usedFixed;
          if (IVar17 != 0) {
            this_02 = (TypeUpdater *)&(builder.wasm)->features;
            bVar10 = false;
            IVar5 = 0;
            local_b0 = this_02;
            do {
              IVar6 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_a8,IVar5);
              pppEVar9 = local_a8.children.flexible.
                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                         ._M_impl.super__Vector_impl_data._M_start + ((ulong)IVar6 - 4);
              if (IVar6 < 4) {
                pppEVar9 = local_a8.children.fixed._M_elems + IVar6;
              }
              pEVar14 = **pppEVar9;
              local_c0 = pEVar14;
              if (bVar10) {
                TypeUpdater::noteRecursiveRemoval(this_02,pEVar14);
              }
              else if ((pEVar14->type).id == 1) {
                if (remainingChildren.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    remainingChildren.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  bVar10 = true;
                  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                  _M_realloc_insert<wasm::Expression*const&>
                            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                             auStack_58,
                             (iterator)
                             remainingChildren.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,&local_c0);
                }
                else {
                  *remainingChildren.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start = pEVar14;
                  remainingChildren.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       remainingChildren.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1;
                  bVar10 = true;
                }
              }
              else {
                this_01 = (Drop *)MixedArena::allocSpace(&(local_68.wasm)->allocator,0x18,8);
                (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
                     DropId;
                (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.
                id = 0;
                this_01->value = pEVar14;
                Drop::finalize(this_01);
                child = (Expression *)this_01;
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58
                           ,&child);
                this_02 = local_b0;
              }
              IVar5 = IVar5 + 1;
            } while (IVar17 != IVar5);
          }
          if (local_a8.children.flexible.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8.children.flexible.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.children.flexible.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          BVar4.wasm = builder.wasm;
          if ((long)remainingChildren.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 == 8) {
            expression = *(Block **)auStack_58;
          }
          else {
            expression = Builder::
                         makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                                   (&local_68,
                                    (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)auStack_58);
          }
          replaceCurrent((DeadCodeElimination *)BVar4.wasm,(Expression *)expression);
          if (auStack_58 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_58,
                            (long)remainingChildren.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
          }
        }
      }
      return;
    }
    if (*(long *)(*(long *)(curr + 1) + 8) != 1) {
      if ((curr->type).id == 1) {
        return;
      }
      if (*(long *)(curr + 2) == 0) {
        return;
      }
      if (*(long *)(curr[1].type.id + 8) != 1) {
        return;
      }
      if (*(long *)(*(long *)(curr + 2) + 8) != 1) {
        return;
      }
      goto LAB_006d1b2d;
    }
    TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,(Expression *)curr[1].type.id);
    if (*(Expression **)(curr + 2) != (Expression *)0x0) {
      TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,*(Expression **)(curr + 2));
    }
    pEVar14 = *(Expression **)(curr + 1);
  }
  else {
    if (IVar1 != LoopId) {
      if (IVar1 != TryId) goto LAB_006d1933;
      if (curr == (Expression *)0x0) {
        handle_unreachable("unimplemented DCE control flow structure",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DeadCodeElimination.cpp"
                           ,0xb3);
      }
      if (*(long *)(curr + 5) == 0) {
        bVar3 = 1;
      }
      else {
        bVar3 = 1;
        lVar13 = 0;
        do {
          bVar3 = bVar3 & *(long *)(*(long *)(curr[4].type.id + lVar13 * 8) + 8) == 1;
          lVar13 = lVar13 + 1;
        } while (*(long *)(curr + 5) != lVar13);
      }
      if ((curr->type).id == 1) {
        return;
      }
      if (!(bool)(*(long *)(*(long *)(curr + 2) + 8) == 1 & bVar3)) {
        return;
      }
      goto LAB_006d1b2d;
    }
    pEVar14 = *(Expression **)(curr + 2);
    if (pEVar14->_id != UnreachableId) {
      return;
    }
  }
LAB_006d1abd:
  replaceCurrent(this,pEVar14);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    if (!Properties::isControlFlowStructure(curr)) {
      // Control flow structures require special handling, but others are
      // simple.
      if (curr->type == Type::unreachable) {
        // This may be dead code. Check if there is an unreachable child.
        bool hasUnreachableChild = false;
        for (auto* child : ChildIterator(curr)) {
          if (child->type == Type::unreachable) {
            hasUnreachableChild = true;
            break;
          }
        }
        if (hasUnreachableChild) {
          // This is indeed unreachable code, made unreachable by that child.
          Builder builder(*getModule());
          std::vector<Expression*> remainingChildren;
          bool afterUnreachable = false;
          for (auto* child : ChildIterator(curr)) {
            if (afterUnreachable) {
              typeUpdater.noteRecursiveRemoval(child);
              continue;
            }
            if (child->type == Type::unreachable) {
              remainingChildren.push_back(child);
              afterUnreachable = true;
            } else {
              remainingChildren.push_back(builder.makeDrop(child));
            }
          }
          if (remainingChildren.size() == 1) {
            replaceCurrent(remainingChildren[0]);
          } else {
            replaceCurrent(builder.makeBlock(remainingChildren));
          }
        }
      }
      return;
    }
    // This is a control flow structure.
    if (auto* block = curr->dynCast<Block>()) {
      auto& list = block->list;
      // The index from which to remove, which is one after the first
      // unreachable instruction. Note that 0 is not a valid value, so we can
      // use it as such.
      Index removeFromHere = 0;
      for (Index i = 0; i < list.size(); i++) {
        if (list[i]->type == Type::unreachable) {
          removeFromHere = i + 1;
          break;
        }
      }
      if (removeFromHere != 0) {
        for (Index i = removeFromHere; i < list.size(); i++) {
          typeUpdater.noteRecursiveRemoval(list[i]);
        }
        list.resize(removeFromHere);
        if (list.size() == 1 && list[0]->is<Unreachable>()) {
          replaceCurrent(list[0]);
          return;
        }
      }
      // Finally, if there is no need for a concrete type (which is when there
      // is one marked, but nothing breaks to it, and also the block does not
      // have a concrete value flowing out) then remove it, which may allow
      // more reduction.
      if (block->type.isConcrete() && list.back()->type == Type::unreachable &&
          !typeUpdater.hasBreaks(block)) {
        typeUpdater.changeType(block, Type::unreachable);
      }
    } else if (auto* iff = curr->dynCast<If>()) {
      if (iff->condition->type == Type::unreachable) {
        typeUpdater.noteRecursiveRemoval(iff->ifTrue);
        if (iff->ifFalse) {
          typeUpdater.noteRecursiveRemoval(iff->ifFalse);
        }
        replaceCurrent(iff->condition);
        return;
      }
      // If both arms are unreachable, there is no need for a concrete type,
      // which may allow more reduction.
      if (iff->type != Type::unreachable && iff->ifFalse &&
          iff->ifTrue->type == Type::unreachable &&
          iff->ifFalse->type == Type::unreachable) {
        typeUpdater.changeType(iff, Type::unreachable);
      }
    } else if (auto* loop = curr->dynCast<Loop>()) {
      // The loop body may have unreachable type if it branches back to the
      // loop top, for example. The only case we look for here is where we've
      // already removed the entire body as dead code.
      if (loop->body->is<Unreachable>()) {
        replaceCurrent(loop->body);
      }
    } else if (auto* tryy = curr->dynCast<Try>()) {
      // If both try body and catch body are unreachable, there is no need for a
      // concrete type, which may allow more reduction.
      bool allCatchesUnreachable = true;
      for (auto* catchBody : tryy->catchBodies) {
        allCatchesUnreachable &= catchBody->type == Type::unreachable;
      }
      if (tryy->type != Type::unreachable &&
          tryy->body->type == Type::unreachable && allCatchesUnreachable) {
        typeUpdater.changeType(tryy, Type::unreachable);
      }
    } else {
      WASM_UNREACHABLE("unimplemented DCE control flow structure");
    }
  }